

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O2

void __thiscall OpenMD::NPAT::evolveEtaA(NPAT *this)

{
  ulong uVar1;
  
  uVar1 = (ulong)this->axis_;
  (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[uVar1][uVar1] =
       (((this->super_NPT).targetPressure / -163882576.0 +
        *(double *)
         ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                super_RectMatrix<double,_3U,_3U>.data_ + uVar1 * 0x20)) *
       (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 *
       (this->super_NPT).instaVol) / ((this->super_NPT).NkBT * (this->super_NPT).tb2) +
       (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[uVar1]
       [uVar1];
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&this->oldEta_,(RectMatrix<double,_3U,_3U> *)&this->eta);
  return;
}

Assistant:

void NPAT::evolveEtaA() {
    eta(axis_, axis_) +=
        dt2 * instaVol *
        (press(axis_, axis_) - targetPressure / Constants::pressureConvert) /
        (NkBT * tb2);
    oldEta_ = eta;
  }